

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O0

decNumber * uprv_decNumberLn_63(decNumber *res,decNumber *rhs,decContext *set)

{
  uint32_t uVar1;
  uint32_t local_24;
  decContext *pdStack_20;
  uint32_t status;
  decContext *set_local;
  decNumber *rhs_local;
  decNumber *res_local;
  
  local_24 = 0;
  pdStack_20 = set;
  set_local = (decContext *)rhs;
  rhs_local = res;
  uVar1 = decCheckMath(rhs,set,&local_24);
  if (uVar1 == 0) {
    decLnOp(rhs_local,(decNumber *)set_local,pdStack_20,&local_24);
  }
  if (local_24 != 0) {
    decStatus(rhs_local,local_24,pdStack_20);
  }
  return rhs_local;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberLn(decNumber *res, const decNumber *rhs,
                        decContext *set) {
  uInt status=0;                   /* accumulator  */
  #if DECSUBSET
  decNumber *allocrhs=NULL;        /* non-NULL if rounded rhs allocated  */
  #endif

  #if DECCHECK
  if (decCheckOperands(res, DECUNUSED, rhs, set)) return res;
  #endif

  /* Check restrictions; this is a math function; if not violated  */
  /* then carry out the operation.  */
  if (!decCheckMath(rhs, set, &status)) do { /* protect allocation  */
    #if DECSUBSET
    if (!set->extended) {
      /* reduce operand and set lostDigits status, as needed  */
      if (rhs->digits>set->digits) {
        allocrhs=decRoundOperand(rhs, set, &status);
        if (allocrhs==NULL) break;
        rhs=allocrhs;
        }
      /* special check in subset for rhs=0  */
      if (ISZERO(rhs)) {                /* +/- zeros -> error  */
        status|=DEC_Invalid_operation;
        break;}
      } /* extended=0  */
    #endif
    decLnOp(res, rhs, set, &status);
    } while(0);                         /* end protected  */

  #if DECSUBSET
  if (allocrhs !=NULL) free(allocrhs);  /* drop any storage used  */
  #endif
  /* apply significant status  */
  if (status!=0) decStatus(res, status, set);
  #if DECCHECK
  decCheckInexact(res, set);
  #endif
  return res;
  }